

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test1.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Chunk local_b0;
  Chunk ch2;
  Chunk local_98;
  Chunk ch1;
  size_t test_riff_len;
  uint8_t test_riff [108];
  char **argv_local;
  int argc_local;
  
  test_riff[0x58] = '\0';
  test_riff[0x59] = '\0';
  test_riff[0x5a] = 'f';
  test_riff[0x5b] = 'i';
  test_riff[0x5c] = 'n';
  test_riff[0x5d] = 'a';
  test_riff[0x5e] = 'l';
  test_riff[0x5f] = ' ';
  test_riff[0x60] = 't';
  test_riff[0x61] = 'e';
  test_riff[0x62] = 's';
  test_riff[99] = 't';
  builtin_memcpy(test_riff + 0x48,"stseqt\x12",8);
  test_riff[0x50] = '\0';
  test_riff[0x51] = '\0';
  test_riff[0x52] = 't';
  test_riff[0x53] = 'e';
  test_riff[0x54] = 's';
  test_riff[0x55] = 't';
  test_riff[0x56] = '\n';
  test_riff[0x57] = '\0';
  builtin_memcpy(test_riff + 0x38,"is is another te",0x10);
  builtin_memcpy(test_riff + 0x28,"sttest\x18",8);
  test_riff[0x30] = '\0';
  test_riff[0x31] = '\0';
  test_riff[0x32] = 'h';
  test_riff[0x33] = 'e';
  test_riff[0x34] = 'y';
  test_riff[0x35] = ' ';
  test_riff[0x36] = 't';
  test_riff[0x37] = 'h';
  builtin_memcpy(test_riff + 0x18,"hey this is a te",0x10);
  builtin_memcpy(test_riff,"smplLIST>",10);
  test_riff[10] = '\0';
  test_riff[0xb] = '\0';
  test_riff[0xc] = 't';
  test_riff[0xd] = 's';
  test_riff[0xe] = 't';
  test_riff[0xf] = '1';
  test_riff[0x10] = 't';
  test_riff[0x11] = 'e';
  test_riff[0x12] = 's';
  test_riff[0x13] = 't';
  test_riff[0x14] = '\x12';
  test_riff[0x15] = '\0';
  test_riff[0x16] = '\0';
  test_riff[0x17] = '\0';
  test_riff_len = 0x6446464952;
  ch1.pimpl = (impl *)0x6c;
  unique0x100002da = argv;
  riffcpp::Chunk::Chunk(&local_98,"test.riff");
  test_chunk(&local_98);
  riffcpp::Chunk::Chunk(&local_b0,&test_riff_len,(size_t)ch1.pimpl);
  test_chunk(&local_b0);
  riffcpp::Chunk::~Chunk(&local_b0);
  riffcpp::Chunk::~Chunk(&local_98);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  std::uint8_t test_riff[] = {
   0x52, 0x49, 0x46, 0x46, 0x64, 0x00, 0x00, 0x00, 0x73, 0x6d, 0x70, 0x6c,
   0x4c, 0x49, 0x53, 0x54, 0x3e, 0x00, 0x00, 0x00, 0x74, 0x73, 0x74, 0x31,
   0x74, 0x65, 0x73, 0x74, 0x12, 0x00, 0x00, 0x00, 0x68, 0x65, 0x79, 0x20,
   0x74, 0x68, 0x69, 0x73, 0x20, 0x69, 0x73, 0x20, 0x61, 0x20, 0x74, 0x65,
   0x73, 0x74, 0x74, 0x65, 0x73, 0x74, 0x18, 0x00, 0x00, 0x00, 0x68, 0x65,
   0x79, 0x20, 0x74, 0x68, 0x69, 0x73, 0x20, 0x69, 0x73, 0x20, 0x61, 0x6e,
   0x6f, 0x74, 0x68, 0x65, 0x72, 0x20, 0x74, 0x65, 0x73, 0x74, 0x73, 0x65,
   0x71, 0x74, 0x12, 0x00, 0x00, 0x00, 0x74, 0x65, 0x73, 0x74, 0x0a, 0x00,
   0x00, 0x00, 0x66, 0x69, 0x6e, 0x61, 0x6c, 0x20, 0x74, 0x65, 0x73, 0x74};
  std::size_t test_riff_len = 108;

  riffcpp::Chunk ch1("test.riff");
  test_chunk(ch1);
  riffcpp::Chunk ch2(test_riff, test_riff_len);
  test_chunk(ch2);
}